

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O0

void interpolate_step(int row,int col,response_layer *top,response_layer *middle,
                     response_layer *bottom,float *offsets)

{
  response_layer *in_RCX;
  response_layer *in_RDX;
  int in_ESI;
  int in_EDI;
  response_layer *in_R8;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float ds;
  float dy;
  float dx;
  float neg_gradient [3];
  float dys;
  float dxs;
  float dxy;
  float dss;
  float dyy;
  float dxx;
  float v;
  float hessian [9];
  
  fVar1 = get_response_relative(in_RCX,in_EDI,in_ESI,in_RDX);
  fVar2 = get_response_relative(in_RCX,in_EDI,in_ESI + 1,in_RDX);
  fVar3 = get_response_relative(in_RCX,in_EDI,in_ESI + -1,in_RDX);
  vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar1),ZEXT416((uint)(fVar2 + fVar3))
                 );
  fVar3 = get_response_relative(in_RCX,in_EDI + 1,in_ESI,in_RDX);
  fVar4 = get_response_relative(in_RCX,in_EDI + -1,in_ESI,in_RDX);
  vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar1),ZEXT416((uint)(fVar3 + fVar4))
                 );
  fVar4 = get_response(in_RDX,in_EDI,in_ESI);
  fVar5 = get_response_relative(in_R8,in_EDI,in_ESI,in_RDX);
  vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar1),ZEXT416((uint)(fVar4 + fVar5))
                 );
  fVar1 = get_response_relative(in_RCX,in_EDI + 1,in_ESI + 1,in_RDX);
  get_response_relative(in_RCX,in_EDI + 1,in_ESI + -1,in_RDX);
  get_response_relative(in_RCX,in_EDI + -1,in_ESI + 1,in_RDX);
  get_response_relative(in_RCX,in_EDI + -1,in_ESI + -1,in_RDX);
  get_response(in_RDX,in_EDI,in_ESI + 1);
  get_response(in_RDX,in_EDI,in_ESI + -1);
  get_response_relative(in_R8,in_EDI,in_ESI + 1,in_RDX);
  get_response_relative(in_R8,in_EDI,in_ESI + -1,in_RDX);
  get_response(in_RDX,in_EDI + 1,in_ESI);
  get_response(in_RDX,in_EDI + -1,in_ESI);
  get_response_relative(in_R8,in_EDI + 1,in_ESI,in_RDX);
  get_response_relative(in_R8,in_EDI + -1,in_ESI,in_RDX);
  get_response_relative(in_RCX,in_EDI,in_ESI + 1,in_RDX);
  get_response_relative(in_RCX,in_EDI,in_ESI + -1,in_RDX);
  get_response_relative(in_RCX,in_EDI + 1,in_ESI,in_RDX);
  get_response_relative(in_RCX,in_EDI + -1,in_ESI,in_RDX);
  get_response(in_RDX,in_EDI,in_ESI);
  get_response_relative(in_R8,in_EDI,in_ESI,in_RDX);
  solve_linear_3x3_system
            ((float *)CONCAT44(fVar1,fVar4),(float *)CONCAT44(fVar3,fVar2),(float *)0x10c00c);
  return;
}

Assistant:

void interpolate_step(int row, int col,
                      struct response_layer *top, struct response_layer *middle, struct response_layer *bottom,
                      float offsets[3]) {

    assert(top != NULL && middle != NULL && bottom != NULL);
    assert(offsets != NULL);

    float hessian[9];
    {
        float v = get_response_relative(middle, row, col, top);

        // computing second order partial derivatives in xy position, as well as scale direction
        float dxx = get_response_relative(middle, row, col + 1, top) + get_response_relative(middle, row, col - 1, top) - 2.0f * v;
        float dyy = get_response_relative(middle, row + 1, col, top) + get_response_relative(middle, row - 1, col, top) - 2.0f * v;
        float dss = get_response(top, row, col) + get_response_relative(bottom, row, col, top) - 2.0f * v;

        float dxy = (get_response_relative(middle, row + 1, col + 1, top) - get_response_relative(middle, row + 1, col - 1, top) -
                     get_response_relative(middle, row - 1, col + 1, top) + get_response_relative(middle, row - 1, col - 1, top)) / 4.0f;
        float dxs = (get_response(top, row, col + 1) - get_response(top, row, col - 1) -
                     get_response_relative(bottom, row, col + 1, top) + get_response_relative(bottom, row, col - 1, top)) / 4.0f;
        float dys = (get_response(top, row + 1, col) - get_response(top, row - 1, col) -
                     get_response_relative(bottom, row + 1, col, top) + get_response_relative(bottom, row - 1, col, top)) / 4.0f;

        // constructing hessian 3x3 matrix:
        // dxx dxy dxs
        // dxy dyy dys
        // dxs dys dss
        hessian[0] = dxx;
        hessian[1] = dxy;
        hessian[2] = dxs;
        hessian[3] = dxy;
        hessian[4] = dyy;
        hessian[5] = dys;
        hessian[6] = dxs;
        hessian[7] = dys;
        hessian[8] = dss;
    }

    float neg_gradient[3];
    {
        float dx = (get_response_relative(middle, row, col + 1, top) - get_response_relative(middle, row, col - 1, top)) / 2.0f;
        float dy = (get_response_relative(middle, row + 1, col, top) - get_response_relative(middle, row - 1, col, top)) / 2.0f;
        float ds = (get_response(top, row, col) - get_response_relative(bottom, row, col, top)) / 2.0f;

        // constructing negative gradient 3x1 vector
        neg_gradient[0] = -dx;
        neg_gradient[1] = -dy;
        neg_gradient[2] = -ds;
    }

    // solving linear system hessian * offsets = neg_gradient to get sub-pixel offsets
    solve_linear_3x3_system(hessian, neg_gradient, offsets);

}